

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void get_tile_buffers(AV1Decoder *pbi,uint8_t *data,uint8_t *data_end,
                     TileBufferDec (*tile_buffers) [64],int start_tile,int end_tile)

{
  aom_internal_error_info *info;
  uint uVar1;
  uint uVar2;
  int sz;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  size_t *local_58;
  
  uVar1 = (pbi->common).tiles.cols;
  uVar2 = (pbi->common).tiles.rows;
  info = &pbi->error;
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  uVar5 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar5 = 0;
  }
  local_58 = &(*tile_buffers)[0].size;
  iVar7 = 0;
  for (uVar4 = 0; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    iVar6 = iVar7;
    for (lVar8 = 0; (ulong)uVar1 << 4 != lVar8; lVar8 = lVar8 + 0x10) {
      if (iVar6 <= end_tile && start_tile <= iVar6) {
        if (data_end <= data) {
          aom_internal_error(info,AOM_CODEC_CORRUPT_FRAME,"Data ended before all tiles were read.");
        }
        if (end_tile == iVar6) {
          uVar9 = (long)data_end - (long)data;
        }
        else {
          sz = pbi->tile_size_bytes;
          if ((ulong)((long)data_end - (long)data) <= (long)sz - 1U) {
            aom_internal_error(info,AOM_CODEC_CORRUPT_FRAME,"Not enough data to read tile size");
          }
          sVar3 = mem_get_varsize(data,sz);
          uVar9 = sVar3 + 1;
          data = data + sz;
          if ((ulong)((long)data_end - (long)data) < uVar9) {
            aom_internal_error(info,AOM_CODEC_CORRUPT_FRAME,"Truncated packet or corrupt tile size")
            ;
          }
        }
        *(uint8_t **)((long)local_58 + lVar8 + -8) = data;
        *(ulong *)((long)local_58 + lVar8) = uVar9;
        data = data + uVar9;
      }
      iVar6 = iVar6 + 1;
    }
    iVar7 = iVar7 + uVar1;
    local_58 = local_58 + 0x80;
  }
  return;
}

Assistant:

static inline void get_tile_buffers(
    AV1Decoder *pbi, const uint8_t *data, const uint8_t *data_end,
    TileBufferDec (*const tile_buffers)[MAX_TILE_COLS], int start_tile,
    int end_tile) {
  AV1_COMMON *const cm = &pbi->common;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  int tc = 0;

  for (int r = 0; r < tile_rows; ++r) {
    for (int c = 0; c < tile_cols; ++c, ++tc) {
      TileBufferDec *const buf = &tile_buffers[r][c];

      const int is_last = (tc == end_tile);
      const size_t hdr_offset = 0;

      if (tc < start_tile || tc > end_tile) continue;

      if (data + hdr_offset >= data_end)
        aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                           "Data ended before all tiles were read.");
      data += hdr_offset;
      get_tile_buffer(data_end, pbi->tile_size_bytes, is_last, &pbi->error,
                      &data, buf);
    }
  }
}